

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_raw<std::vector<short,std::allocator<short>>>
          (Simplex_tree<MiniSTOptions> *this,vector<short,_std::allocator<short>_> *simplex,
          Filtration_value *filtration)

{
  short sVar1;
  bool bVar2;
  Vertex_handle VVar3;
  int iVar4;
  pointer ppVar5;
  reference psVar6;
  type tVar7;
  undefined8 extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar8;
  undefined1 local_98 [4];
  int dim;
  undefined1 local_81;
  undefined8 *local_80;
  undefined1 local_78 [40];
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_50;
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_48;
  const_iterator vi;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  res_insert;
  Siblings *curr_sib;
  Filtration_value *filtration_local;
  vector<short,_std::allocator<short>_> *simplex_local;
  Simplex_tree<MiniSTOptions> *this_local;
  
  res_insert._8_8_ =
       &simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage;
  std::
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  ::
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool,_true>
            ((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
              *)&vi);
  local_48._M_current =
       (short *)std::vector<short,_std::allocator<short>_>::begin
                          ((vector<short,_std::allocator<short>_> *)filtration);
  while( true ) {
    local_78._32_8_ =
         std::vector<short,_std::allocator<short>_>::end
                   ((vector<short,_std::allocator<short>_> *)filtration);
    local_50 = std::
               prev<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>>
                         ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                           )local_78._32_8_,1);
    bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar2) {
      psVar6 = __gnu_cxx::
               __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_48);
      sVar1 = *psVar6;
      VVar3 = null_vertex((Simplex_tree<MiniSTOptions> *)simplex);
      local_81 = 0;
      if (sVar1 == VVar3) {
        local_80 = (undefined8 *)__cxa_allocate_exception(8);
        local_81 = 1;
        *local_80 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_80,&char_const*::typeinfo,0);
      }
      psVar6 = __gnu_cxx::
               __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_48);
      insert_node_<true,false,true,double_const&>
                ((Simplex_tree<MiniSTOptions> *)local_98,(Siblings *)simplex,res_insert._8_2_,
                 (double *)(ulong)(uint)(int)*psVar6);
      std::
      pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
      ::operator=((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
                   *)&vi,(type)local_98);
      if (((byte)res_insert.first.m_ptr & 1) != 0) {
        tVar7 = boost::size<std::vector<short,std::allocator<short>>>
                          ((vector<short,_std::allocator<short>_> *)filtration);
        iVar4 = (int)tVar7 + -1;
        if (*(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish < iVar4) {
          *(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar4;
        }
      }
      std::
      pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
      ::
      pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool,_true>
                ((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
                  *)this,(pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
                          *)&vi);
      pVar8._8_8_ = extraout_RDX;
      pVar8.first.m_ptr =
           (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
            *)this;
      return pVar8;
    }
    psVar6 = __gnu_cxx::
             __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&local_48);
    sVar1 = *psVar6;
    VVar3 = null_vertex((Simplex_tree<MiniSTOptions> *)simplex);
    local_78[0x17] = 0;
    if (sVar1 == VVar3) break;
    psVar6 = __gnu_cxx::
             __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&local_48);
    insert_node_<false,true,false,double_const&>
              ((Simplex_tree<MiniSTOptions> *)local_78,(Siblings *)simplex,res_insert._8_2_,
               (double *)(ulong)(uint)(int)*psVar6);
    std::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
    ::operator=((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
                 *)&vi,(type)local_78);
    ppVar5 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>
             ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>
                           *)&vi);
    res_insert._8_8_ =
         Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>::children
                   (&ppVar5->second);
    __gnu_cxx::__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
    operator++(&local_48);
  }
  local_78._24_8_ = __cxa_allocate_exception(8);
  local_78[0x17] = 1;
  *(char **)local_78._24_8_ = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(local_78._24_8_,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }